

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall
google::protobuf::io::Printer::Sub::Sub<char_const(&)[5]>(Sub *this,string *key,char (*value) [5])

{
  char (*value_local) [5];
  string *key_local;
  Sub *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)key);
  ValueImpl<true>::ValueImpl<char_const(&)[5],void>(&this->value_,value);
  std::optional<google::protobuf::io::Printer::AnnotationRecord>::optional(&this->annotation_);
  return;
}

Assistant:

Sub(std::string key, Value&& value)
      : key_(std::move(key)),
        value_(std::forward<Value>(value)),
        annotation_(absl::nullopt) {}